

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

nanoseconds __thiscall anon_unknown.dwarf_f6f6::AudioState::getClockNoLock(AudioState *this)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  pointer pAVar4;
  undefined8 *puVar5;
  duration<long,_std::ratio<1L,_1000000000L>_> *pdVar6;
  duration<long,_std::ratio<1L,_1L>_> *__d;
  long in_RDI;
  ALint status_1;
  ALint queued;
  ALint ioffset_1;
  ALint64SOFT offset_1 [2];
  nanoseconds pts;
  size_t readable;
  size_t roffset;
  size_t woffset;
  ALint status;
  ALint ioffset;
  ALint64SOFT offset [2];
  nanoseconds device_time;
  nanoseconds latency;
  ALCint64SOFT devtimes [2];
  ALCdevice *device;
  nanoseconds pts_1;
  memory_order __b_1;
  memory_order __b;
  duration<long,_std::ratio<1L,_4294967296L>_> *in_stack_fffffffffffffe28;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffe30;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffe38;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffe40;
  duration<long,_std::ratio<1L,_1000000000L>_> *this_00;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffe48;
  duration<long,std::ratio<1l,1000000000l>> local_168 [8];
  long local_160;
  duration<long,std::ratio<1l,4294967296l>> local_158 [8];
  rep local_150;
  rep local_148;
  int local_134;
  undefined1 local_130 [4];
  int local_12c;
  duration<long,_std::ratio<1L,_1000000000L>_> *local_128;
  long local_120;
  undefined8 local_118;
  ulong local_110;
  duration<long,std::ratio<1l,1l>> local_108 [16];
  rep local_f8;
  ulong local_e8;
  duration<long,_std::ratio<1L,_1000000000L>_> *local_e0;
  duration<long,_std::ratio<1L,_1000000000L>_> *local_d8;
  long local_d0;
  duration<long,std::ratio<1l,4294967296l>> local_c8 [8];
  rep local_c0;
  duration<long,std::ratio<1l,1000000000l>> local_b8 [8];
  rep local_b0;
  int local_a0;
  int local_9c;
  long local_98 [2];
  rep local_88;
  rep local_80;
  duration<long,std::ratio<1l,1000000000l>> local_78 [8];
  duration<long,std::ratio<1l,1000000000l>> local_70 [8];
  long local_68;
  long alStack_60 [2];
  undefined8 local_50;
  rep local_48;
  rep local_38;
  duration<long,_std::ratio<1L,_1000000000L>_> *local_30;
  memory_order local_28;
  int local_24;
  duration<long,_std::ratio<1L,_1000000000L>_> *local_20;
  duration<long,_std::ratio<1L,_1000000000L>_> *local_18;
  memory_order local_10;
  int local_c;
  undefined8 *local_8;
  
  if ((anonymous_namespace)::alcGetInteger64vSOFT == (code *)0x0) {
    if (*(long *)(in_RDI + 0x128) == 0) {
      local_118 = *(undefined8 *)(in_RDI + 0xd8);
      if (*(int *)(in_RDI + 0x1a4) != 0) {
        if ((anonymous_namespace)::alGetSourcei64vSOFT == (code *)0x0) {
          alGetSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1025,&local_12c);
          local_128 = (duration<long,_std::ratio<1L,_1000000000L>_> *)((long)local_12c << 0x20);
          local_120 = 0;
        }
        else {
          (*(anonymous_namespace)::alGetSourcei64vSOFT)
                    (*(undefined4 *)(in_RDI + 0x1a4),0x1200,&local_128);
        }
        alGetSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1015,local_130);
        alGetSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1010,&local_134);
        if (local_134 != 0x1014) {
          local_148 = (rep)std::chrono::operator*
                                     (in_stack_fffffffffffffe38,(int *)in_stack_fffffffffffffe30);
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1000l>,void>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
                    (in_stack_fffffffffffffe30,
                     (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe28);
          in_stack_fffffffffffffe30 = local_128;
          pAVar4 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                   operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                               *)0x11806d);
          local_160 = (long)in_stack_fffffffffffffe30 / (long)pAVar4->sample_rate;
          std::chrono::duration<long,std::ratio<1l,4294967296l>>::duration<long,void>
                    (local_158,&local_160);
          local_150 = (rep)std::chrono::
                           duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,4294967296l>>
                                     (in_stack_fffffffffffffe28);
          std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                    (in_stack_fffffffffffffe30,
                     (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe28);
        }
        if (local_134 == 0x1012) {
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
                    (local_168,&local_120);
          std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
                    (in_stack_fffffffffffffe30,
                     (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe28);
        }
      }
      std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::zero();
      pdVar6 = std::max<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                         ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe28,
                          (duration<long,_std::ratio<1L,_1000000000L>_> *)0x118115);
      local_38 = pdVar6->__r;
    }
    else {
      local_88 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::min();
      bVar2 = std::chrono::operator==
                        (in_stack_fffffffffffffe40,
                         (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe38);
      if (bVar2) {
        local_38 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::zero();
      }
      else {
        if ((anonymous_namespace)::alGetSourcei64vSOFT == (code *)0x0) {
          alGetSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1025,&local_9c);
          local_98[0] = (long)local_9c << 0x20;
          local_98[1] = 0;
        }
        else {
          (*(anonymous_namespace)::alGetSourcei64vSOFT)
                    (*(undefined4 *)(in_RDI + 0x1a4),0x1200,local_98);
        }
        alGetSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1010,&local_a0);
        memset(&local_38,0,8);
        if ((local_a0 == 0x1012) || (local_a0 == 0x1013)) {
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
                    (local_b8,local_98 + 1);
          local_b0 = (rep)std::chrono::operator-
                                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
          lVar1 = local_98[0];
          pAVar4 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                   operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                               *)0x117c6f);
          local_d0 = lVar1 / (long)pAVar4->sample_rate;
          std::chrono::duration<long,std::ratio<1l,4294967296l>>::duration<long,void>
                    (local_c8,&local_d0);
          local_c0 = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,4294967296l>>
                                    (in_stack_fffffffffffffe28);
          local_38 = (rep)std::chrono::operator+
                                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        }
        else {
          puVar5 = (undefined8 *)(in_RDI + 0x138);
          local_c = 2;
          local_8 = puVar5;
          local_10 = std::operator&(memory_order_acquire,__memory_order_mask);
          if (local_c - 1U < 2) {
            local_18 = (duration<long,_std::ratio<1L,_1000000000L>_> *)*puVar5;
          }
          else if (local_c == 5) {
            local_18 = (duration<long,_std::ratio<1L,_1000000000L>_> *)*puVar5;
          }
          else {
            local_18 = (duration<long,_std::ratio<1L,_1000000000L>_> *)*puVar5;
          }
          local_d8 = local_18;
          pdVar6 = (duration<long,_std::ratio<1L,_1000000000L>_> *)(in_RDI + 0x130);
          local_24 = 0;
          local_20 = pdVar6;
          local_28 = std::operator&(memory_order_relaxed,__memory_order_mask);
          if (local_24 - 1U < 2) {
            local_30 = (duration<long,_std::ratio<1L,_1000000000L>_> *)pdVar6->__r;
          }
          else if (local_24 == 5) {
            local_30 = (duration<long,_std::ratio<1L,_1000000000L>_> *)pdVar6->__r;
          }
          else {
            local_30 = (duration<long,_std::ratio<1L,_1000000000L>_> *)pdVar6->__r;
          }
          local_e0 = local_30;
          this_00 = local_d8;
          if (local_d8 < local_30) {
            this_00 = (duration<long,_std::ratio<1L,_1000000000L>_> *)
                      ((long)&local_d8->__r + *(long *)(in_RDI + 0x128));
          }
          local_e8 = (long)this_00 - (long)local_30;
          __d = (duration<long,_std::ratio<1L,_1L>_> *)(in_RDI + 0xd8);
          local_110 = local_e8 / *(uint *)(in_RDI + 0x144);
          std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
                    (local_108,&local_110);
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1l>,void>(this_00,__d);
          std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                    ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                     0x117ee8);
          local_f8 = (rep)std::chrono::operator/
                                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)__d,
                                     (int *)in_stack_fffffffffffffe30);
          local_38 = (rep)std::chrono::operator-(pdVar6,this_00);
        }
      }
    }
  }
  else {
    local_48 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::min();
    bVar2 = std::chrono::operator==
                      (in_stack_fffffffffffffe40,
                       (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe38);
    if (bVar2) {
      local_38 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::zero();
    }
    else {
      uVar3 = alcGetCurrentContext();
      local_50 = alcGetContextsDevice(uVar3);
      memset(&local_68,0,0x10);
      (*(anonymous_namespace)::alcGetInteger64vSOFT)(local_50,0x1602,2,&local_68);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
                (local_70,alStack_60);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
                (local_78,&local_68);
      local_80 = (rep)std::chrono::operator-(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      local_38 = (rep)std::chrono::operator-(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    }
  }
  return (nanoseconds)local_38;
}

Assistant:

nanoseconds AudioState::getClockNoLock()
{
    // The audio clock is the timestamp of the sample currently being heard.
    if(alcGetInteger64vSOFT)
    {
        // If device start time = min, we aren't playing yet.
        if(mDeviceStartTime == nanoseconds::min())
            return nanoseconds::zero();

        // Get the current device clock time and latency.
        auto device = alcGetContextsDevice(alcGetCurrentContext());
        ALCint64SOFT devtimes[2]{0,0};
        alcGetInteger64vSOFT(device, ALC_DEVICE_CLOCK_LATENCY_SOFT, 2, devtimes);
        auto latency = nanoseconds{devtimes[1]};
        auto device_time = nanoseconds{devtimes[0]};

        // The clock is simply the current device time relative to the recorded
        // start time. We can also subtract the latency to get more a accurate
        // position of where the audio device actually is in the output stream.
        return device_time - mDeviceStartTime - latency;
    }

    if(mBufferDataSize > 0)
    {
        if(mDeviceStartTime == nanoseconds::min())
            return nanoseconds::zero();

        /* With a callback buffer and no device clock, mDeviceStartTime is
         * actually the timestamp of the first sample frame played. The audio
         * clock, then, is that plus the current source offset.
         */
        ALint64SOFT offset[2];
        if(alGetSourcei64vSOFT)
            alGetSourcei64vSOFT(mSource, AL_SAMPLE_OFFSET_LATENCY_SOFT, offset);
        else
        {
            ALint ioffset;
            alGetSourcei(mSource, AL_SAMPLE_OFFSET, &ioffset);
            offset[0] = ALint64SOFT{ioffset} << 32;
            offset[1] = 0;
        }
        /* NOTE: The source state must be checked last, in case an underrun
         * occurs and the source stops between getting the state and retrieving
         * the offset+latency.
         */
        ALint status;
        alGetSourcei(mSource, AL_SOURCE_STATE, &status);

        nanoseconds pts{};
        if(status == AL_PLAYING || status == AL_PAUSED)
            pts = mDeviceStartTime - nanoseconds{offset[1]} +
                duration_cast<nanoseconds>(fixed32{offset[0] / mCodecCtx->sample_rate});
        else
        {
            /* If the source is stopped, the pts of the next sample to be heard
             * is the pts of the next sample to be buffered, minus the amount
             * already in the buffer ready to play.
             */
            const size_t woffset{mWritePos.load(std::memory_order_acquire)};
            const size_t roffset{mReadPos.load(std::memory_order_relaxed)};
            const size_t readable{((woffset >= roffset) ? woffset : (mBufferDataSize+woffset)) -
                roffset};

            pts = mCurrentPts - nanoseconds{seconds{readable/mFrameSize}}/mCodecCtx->sample_rate;
        }

        return pts;
    }

    /* The source-based clock is based on 4 components:
     * 1 - The timestamp of the next sample to buffer (mCurrentPts)
     * 2 - The length of the source's buffer queue
     *     (AudioBufferTime*AL_BUFFERS_QUEUED)
     * 3 - The offset OpenAL is currently at in the source (the first value
     *     from AL_SAMPLE_OFFSET_LATENCY_SOFT)
     * 4 - The latency between OpenAL and the DAC (the second value from
     *     AL_SAMPLE_OFFSET_LATENCY_SOFT)
     *
     * Subtracting the length of the source queue from the next sample's
     * timestamp gives the timestamp of the sample at the start of the source
     * queue. Adding the source offset to that results in the timestamp for the
     * sample at OpenAL's current position, and subtracting the source latency
     * from that gives the timestamp of the sample currently at the DAC.
     */
    nanoseconds pts{mCurrentPts};
    if(mSource)
    {
        ALint64SOFT offset[2];
        if(alGetSourcei64vSOFT)
            alGetSourcei64vSOFT(mSource, AL_SAMPLE_OFFSET_LATENCY_SOFT, offset);
        else
        {
            ALint ioffset;
            alGetSourcei(mSource, AL_SAMPLE_OFFSET, &ioffset);
            offset[0] = ALint64SOFT{ioffset} << 32;
            offset[1] = 0;
        }
        ALint queued, status;
        alGetSourcei(mSource, AL_BUFFERS_QUEUED, &queued);
        alGetSourcei(mSource, AL_SOURCE_STATE, &status);

        /* If the source is AL_STOPPED, then there was an underrun and all
         * buffers are processed, so ignore the source queue. The audio thread
         * will put the source into an AL_INITIAL state and clear the queue
         * when it starts recovery.
         */
        if(status != AL_STOPPED)
        {
            pts -= AudioBufferTime*queued;
            pts += duration_cast<nanoseconds>(fixed32{offset[0] / mCodecCtx->sample_rate});
        }
        /* Don't offset by the latency if the source isn't playing. */
        if(status == AL_PLAYING)
            pts -= nanoseconds{offset[1]};
    }

    return std::max(pts, nanoseconds::zero());
}